

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.cc
# Opt level: O0

string * EncodeHex_abi_cxx11_(string *__return_storage_ptr__,Span<const_unsigned_char> in)

{
  byte bVar1;
  iterator puVar2;
  uint8_t b;
  iterator __end1;
  iterator __begin1;
  Span<const_unsigned_char> *__range1;
  undefined1 local_20 [8];
  Span<const_unsigned_char> in_local;
  string *ret;
  
  in_local.data_ = (uchar *)in.size_;
  local_20 = (undefined1  [8])in.data_;
  in_local.size_ = (size_t)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bssl::Span<const_unsigned_char>::size((Span<const_unsigned_char> *)local_20);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  __end1 = bssl::Span<const_unsigned_char>::begin((Span<const_unsigned_char> *)local_20);
  puVar2 = bssl::Span<const_unsigned_char>::end((Span<const_unsigned_char> *)local_20);
  for (; __end1 != puVar2; __end1 = __end1 + 1) {
    bVar1 = *__end1;
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,"0123456789abcdef"[bVar1 >> 4]);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,"0123456789abcdef"[bVar1 & 0xf]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EncodeHex(bssl::Span<const uint8_t> in) {
  static const char kHexDigits[] = "0123456789abcdef";
  std::string ret;
  ret.reserve(in.size() * 2);
  for (uint8_t b : in) {
    ret += kHexDigits[b >> 4];
    ret += kHexDigits[b & 0xf];
  }
  return ret;
}